

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

void duckdb::StandardFixedSizeAppend::Append<duckdb::uhugeint_t>
               (SegmentStatistics *stats,data_ptr_t target,idx_t target_offset,
               UnifiedVectorFormat *adata,idx_t offset,idx_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  undefined8 uVar4;
  data_ptr_t pdVar5;
  idx_t iVar6;
  long lVar7;
  bool bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  uhugeint_t new_value;
  uhugeint_t new_value_00;
  
  pdVar2 = adata->data;
  if ((adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pdVar5 = target + target_offset * 0x10;
    while (bVar8 = count != 0, count = count - 1, bVar8) {
      psVar3 = adata->sel->sel_vector;
      iVar6 = offset;
      if (psVar3 != (sel_t *)0x0) {
        iVar6 = (idx_t)psVar3[offset];
      }
      lVar7 = iVar6 * 0x10;
      new_value_00.upper = *(uint64_t *)(pdVar2 + lVar7 + 8);
      new_value_00.lower = *(uint64_t *)(pdVar2 + lVar7);
      NumericStats::Update<duckdb::uhugeint_t>
                (&(stats->statistics).stats_union.numeric_data,new_value_00);
      uVar4 = *(undefined8 *)(pdVar2 + lVar7 + 8);
      *(undefined8 *)pdVar5 = *(undefined8 *)(pdVar2 + lVar7);
      *(undefined8 *)(pdVar5 + 8) = uVar4;
      pdVar5 = pdVar5 + 0x10;
      offset = offset + 1;
    }
  }
  else {
    pdVar5 = target + target_offset * 0x10;
    while (bVar8 = count != 0, count = count - 1, bVar8) {
      psVar3 = adata->sel->sel_vector;
      iVar6 = offset;
      if (psVar3 != (sel_t *)0x0) {
        iVar6 = (idx_t)psVar3[offset];
      }
      bVar8 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(adata->validity).super_TemplatedValidityMask<unsigned_long>,iVar6);
      if (bVar8) {
        lVar7 = iVar6 * 0x10;
        new_value.upper = *(uint64_t *)(pdVar2 + lVar7 + 8);
        new_value.lower = *(uint64_t *)(pdVar2 + lVar7);
        NumericStats::Update<duckdb::uhugeint_t>
                  (&(stats->statistics).stats_union.numeric_data,new_value);
        pdVar1 = pdVar2 + lVar7;
        uVar9 = *(undefined4 *)pdVar1;
        uVar10 = *(undefined4 *)(pdVar1 + 4);
        uVar11 = *(undefined4 *)(pdVar1 + 8);
        uVar12 = *(undefined4 *)(pdVar1 + 0xc);
      }
      else {
        uVar9 = 0;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
      }
      *(undefined4 *)pdVar5 = uVar9;
      *(undefined4 *)(pdVar5 + 4) = uVar10;
      *(undefined4 *)(pdVar5 + 8) = uVar11;
      *(undefined4 *)(pdVar5 + 0xc) = uVar12;
      offset = offset + 1;
      pdVar5 = pdVar5 + 0x10;
    }
  }
  return;
}

Assistant:

static void Append(SegmentStatistics &stats, data_ptr_t target, idx_t target_offset, UnifiedVectorFormat &adata,
	                   idx_t offset, idx_t count) {
		auto sdata = UnifiedVectorFormat::GetData<T>(adata);
		auto tdata = reinterpret_cast<T *>(target);
		if (!adata.validity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				bool is_null = !adata.validity.RowIsValid(source_idx);
				if (!is_null) {
					stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
					tdata[target_idx] = sdata[source_idx];
				} else {
					// we insert a NullValue<T> in the null gap for debuggability
					// this value should never be used or read anywhere
					tdata[target_idx] = NullValue<T>();
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
				tdata[target_idx] = sdata[source_idx];
			}
		}
	}